

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::ReadData
          (ColumnReader *this,idx_t read_now,data_ptr_t define_out,data_ptr_t repeat_out,
          Vector *result,idx_t result_offset)

{
  uint8_t *defines;
  idx_t iVar1;
  bool bVar2;
  
  if ((result_offset != 0) && (result->vector_type != FLAT_VECTOR)) {
    Vector::Flatten(result,result_offset);
    Vector::Resize(result,result_offset,0x800);
  }
  if (this->page_is_filtered_out == true) {
    FlatVector::VerifyFlatVector(result);
    iVar1 = read_now;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 - 1, bVar2) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,result_offset);
      result_offset = result_offset + 1;
    }
  }
  else {
    bVar2 = PrepareRead(this,read_now,define_out,repeat_out,result_offset);
    defines = (uint8_t *)0x0;
    if (!bVar2) {
      defines = define_out;
    }
    switch(this->encoding) {
    case DICTIONARY:
      DictionaryDecoder::Read(&this->dictionary_decoder,defines,read_now,result,result_offset);
      break;
    case DELTA_BINARY_PACKED:
      DeltaBinaryPackedDecoder::Read
                (&this->delta_binary_packed_decoder,defines,read_now,result,result_offset);
      break;
    case RLE:
      RLEDecoder::Read(&this->rle_decoder,defines,read_now,result,result_offset);
      break;
    case DELTA_LENGTH_BYTE_ARRAY:
      DeltaLengthByteArrayDecoder::Read
                (&this->delta_length_byte_array_decoder,&this->block,defines,read_now,result,
                 result_offset);
      break;
    case DELTA_BYTE_ARRAY:
      DeltaByteArrayDecoder::Read
                (&this->delta_byte_array_decoder,defines,read_now,result,result_offset);
      break;
    case BYTE_STREAM_SPLIT:
      ByteStreamSplitDecoder::Read
                (&this->byte_stream_split_decoder,defines,read_now,result,result_offset);
      break;
    default:
      (*this->_vptr_ColumnReader[0xf])(this,&this->block,defines,read_now,result_offset,result);
    }
  }
  this->page_rows_available = this->page_rows_available - read_now;
  return;
}

Assistant:

void ColumnReader::ReadData(idx_t read_now, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result,
                            idx_t result_offset) {
	// flatten the result vector if required
	if (result_offset != 0 && result.GetVectorType() != VectorType::FLAT_VECTOR) {
		result.Flatten(result_offset);
		result.Resize(result_offset, STANDARD_VECTOR_SIZE);
	}
	if (page_is_filtered_out) {
		// page is filtered out - emit NULL for any rows
		auto &validity = FlatVector::Validity(result);
		for (idx_t i = 0; i < read_now; i++) {
			validity.SetInvalid(result_offset + i);
		}
		page_rows_available -= read_now;
		return;
	}
	// read the defines/repeats
	const auto all_valid = PrepareRead(read_now, define_out, repeat_out, result_offset);
	// read the data according to the encoder
	const auto define_ptr = all_valid ? nullptr : static_cast<uint8_t *>(define_out);
	switch (encoding) {
	case ColumnEncoding::DICTIONARY:
		dictionary_decoder.Read(define_ptr, read_now, result, result_offset);
		break;
	case ColumnEncoding::DELTA_BINARY_PACKED:
		delta_binary_packed_decoder.Read(define_ptr, read_now, result, result_offset);
		break;
	case ColumnEncoding::RLE:
		rle_decoder.Read(define_ptr, read_now, result, result_offset);
		break;
	case ColumnEncoding::DELTA_LENGTH_BYTE_ARRAY:
		delta_length_byte_array_decoder.Read(block, define_ptr, read_now, result, result_offset);
		break;
	case ColumnEncoding::DELTA_BYTE_ARRAY:
		delta_byte_array_decoder.Read(define_ptr, read_now, result, result_offset);
		break;
	case ColumnEncoding::BYTE_STREAM_SPLIT:
		byte_stream_split_decoder.Read(define_ptr, read_now, result, result_offset);
		break;
	default:
		Plain(block, define_ptr, read_now, result_offset, result);
		break;
	}
	page_rows_available -= read_now;
}